

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1072::run(TestCase1072 *this)

{
  uchar *__s;
  uchar *puVar1;
  uint i;
  long lVar2;
  Orphanage OVar3;
  Builder BVar4;
  Reader RVar5;
  MallocMessageBuilder message;
  OrphanBuilder local_188;
  uchar *local_168;
  OrphanBuilder local_160;
  OrphanBuilder local_140;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  OVar3 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  OrphanBuilder::initData(&local_188,OVar3.arena,OVar3.capTable,0x11);
  local_140.segment = local_188.segment;
  local_140.capTable = local_188.capTable;
  local_140.location = local_188.location;
  local_140.tag.content = local_188.tag.content;
  BVar4 = OrphanBuilder::asData(&local_140);
  __s = BVar4.super_ArrayPtr<unsigned_char>.ptr;
  memset(__s,0x7b,BVar4.super_ArrayPtr<unsigned_char>.size_);
  OVar3 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  OrphanBuilder::initData(&local_188,OVar3.arena,OVar3.capTable,1);
  local_160.segment = local_188.segment;
  local_160.capTable = local_188.capTable;
  local_160.location = local_188.location;
  local_160.tag.content = local_188.tag.content;
  BVar4 = OrphanBuilder::asData(&local_160);
  *BVar4.super_ArrayPtr<unsigned_char>.ptr = ' ';
  OrphanBuilder::truncate(&local_140,(char *)0x1b,2);
  RVar5 = OrphanBuilder::asDataReader(&local_140);
  puVar1 = RVar5.super_ArrayPtr<const_unsigned_char>.ptr;
  if ((uchar *)RVar5.super_ArrayPtr<const_unsigned_char>.size_ != (uchar *)0x1b &&
      kj::_::Debug::minSeverity < 3) {
    local_168 = (uchar *)CONCAT44(local_168._4_4_,0x1b);
    local_188.tag.content = (uint64_t)RVar5.super_ArrayPtr<const_unsigned_char>.size_;
    kj::_::Debug::log<char_const(&)[41],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x43c,ERROR,"\"failed: expected \" \"(27) == (reader.size())\", 27, reader.size()",
               (char (*) [41])"failed: expected (27) == (reader.size())",(int *)&local_168,
               (unsigned_long *)&local_188);
  }
  if ((__s == puVar1) && (kj::_::Debug::minSeverity < 3)) {
    local_188.tag.content = (uint64_t)__s;
    local_168 = puVar1;
    kj::_::Debug::log<char_const(&)[55],unsigned_char*,unsigned_char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x43d,ERROR,
               "\"failed: expected \" \"(builder.begin()) != (reader.begin())\", builder.begin(), reader.begin()"
               ,(char (*) [55])"failed: expected (builder.begin()) != (reader.begin())",
               (uchar **)&local_188,&local_168);
  }
  lVar2 = 0;
  do {
    if (kj::_::Debug::minSeverity < 3 && puVar1[lVar2] != '{') {
      local_188.tag.content._0_4_ = 0x7b;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char_const&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x440,ERROR,"\"failed: expected \" \"(123) == (reader[i])\", 123, reader[i]",
                 (char (*) [38])"failed: expected (123) == (reader[i])",(int *)&local_188,
                 puVar1 + lVar2);
    }
    if ((__s[lVar2] != '\0') && (kj::_::Debug::minSeverity < 3)) {
      local_188.tag.content = local_188.tag.content & 0xffffffff00000000;
      kj::_::Debug::log<char_const(&)[37],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x441,ERROR,"\"failed: expected \" \"(0) == (builder[i])\", 0, builder[i]",
                 (char (*) [37])"failed: expected (0) == (builder[i])",(int *)&local_188,__s + lVar2
                );
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x11);
  lVar2 = 0;
  do {
    if ((puVar1[lVar2 + 0x11] != '\0') && (kj::_::Debug::minSeverity < 3)) {
      local_188.tag.content = local_188.tag.content & 0xffffffff00000000;
      kj::_::Debug::log<char_const(&)[36],int,unsigned_char_const&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x444,ERROR,"\"failed: expected \" \"(0) == (reader[i])\", 0, reader[i]",
                 (char (*) [36])"failed: expected (0) == (reader[i])",(int *)&local_188,
                 puVar1 + lVar2 + 0x11);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10);
  RVar5 = OrphanBuilder::asDataReader(&local_160);
  if ((*RVar5.super_ArrayPtr<const_unsigned_char>.ptr != ' ') && (kj::_::Debug::minSeverity < 3)) {
    local_188.tag.content._0_4_ = 0x20;
    RVar5 = OrphanBuilder::asDataReader(&local_160);
    kj::_::Debug::log<char_const(&)[50],int,unsigned_char_const&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x447,ERROR,
               "\"failed: expected \" \"(32) == (orphan2.getReader()[0])\", 32, orphan2.getReader()[0]"
               ,(char (*) [50])"failed: expected (32) == (orphan2.getReader()[0])",(int *)&local_188
               ,RVar5.super_ArrayPtr<const_unsigned_char>.ptr);
  }
  if (local_160.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_160);
  }
  if (local_140.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_140);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Orphans, ExtendDataCopy) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<Data>(17);
  auto builder = orphan.get();
  memset(builder.begin(), 123, builder.size());

  auto orphan2 = message.getOrphanage().newOrphan<Data>(1);
  orphan2.get()[0] = 32;

  orphan.truncate(27);

  auto reader = orphan.getReader();
  EXPECT_EQ(27, reader.size());
  EXPECT_NE(builder.begin(), reader.begin());

  for (uint i = 0; i < 17; i++) {
    EXPECT_EQ(123, reader[i]);
    EXPECT_EQ(0, builder[i]);
  }
  for (uint i = 17; i < 27; i++) {
    EXPECT_EQ(0, reader[i]);
  }

  EXPECT_EQ(32, orphan2.getReader()[0]);
}